

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::TcParser::MpVerifyUtf8
          (TcParser *this,string_view wire_bytes,TcParseTableBase *table,FieldEntry *entry,
          uint16_t xform_val)

{
  bool bVar1;
  TcParseTableBase *table_00;
  string_view sVar2;
  string_view sVar3;
  string_view field_name;
  string_view field_name_00;
  bool in_stack_ffffffffffffff68;
  char *local_90;
  internal *local_88;
  char *local_80;
  char *local_68;
  char *local_60;
  internal *local_58;
  char *local_50;
  uint16_t xform_val_local;
  FieldEntry *entry_local;
  TcParseTableBase *table_local;
  string_view wire_bytes_local;
  
  table_00 = (TcParseTableBase *)wire_bytes._M_str;
  if ((short)entry == 0x400) {
    bVar1 = utf8_range::IsStructurallyValid((utf8_range *)this,wire_bytes);
    if (bVar1) {
      wire_bytes_local._M_str._7_1_ = true;
    }
    else {
      sVar2 = MessageName(table_00);
      sVar3 = FieldName(table_00,(FieldEntry *)table);
      local_58 = (internal *)sVar2._M_len;
      local_50 = sVar2._M_str;
      local_68 = (char *)sVar3._M_len;
      local_60 = sVar3._M_str;
      sVar3._M_str = local_68;
      sVar3._M_len = (size_t)local_50;
      field_name._M_str = "parsing";
      field_name._M_len = (size_t)local_60;
      PrintUTF8ErrorLog(local_58,sVar3,field_name,(char *)0x0,in_stack_ffffffffffffff68);
      wire_bytes_local._M_str._7_1_ = false;
    }
  }
  else {
    if (((short)entry == 0x200) &&
       (bVar1 = utf8_range::IsStructurallyValid((utf8_range *)this,wire_bytes), !bVar1)) {
      sVar2 = MessageName(table_00);
      sVar3 = FieldName(table_00,(FieldEntry *)table);
      local_88 = (internal *)sVar2._M_len;
      local_80 = sVar2._M_str;
      local_90 = sVar3._M_str;
      sVar2._M_str = (char *)sVar3._M_len;
      sVar2._M_len = (size_t)local_80;
      field_name_00._M_str = "parsing";
      field_name_00._M_len = (size_t)local_90;
      PrintUTF8ErrorLog(local_88,sVar2,field_name_00,(char *)0x0,sVar3._M_len._0_1_);
    }
    wire_bytes_local._M_str._7_1_ = true;
  }
  return wire_bytes_local._M_str._7_1_;
}

Assistant:

bool TcParser::MpVerifyUtf8(absl::string_view wire_bytes,
                            const TcParseTableBase* table,
                            const FieldEntry& entry, uint16_t xform_val) {
  if (xform_val == field_layout::kTvUtf8) {
    if (!utf8_range::IsStructurallyValid(wire_bytes)) {
      PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry), "parsing",
                        false);
      return false;
    }
    return true;
  }
#ifndef NDEBUG
  if (xform_val == field_layout::kTvUtf8Debug) {
    if (!utf8_range::IsStructurallyValid(wire_bytes)) {
      PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry), "parsing",
                        false);
    }
  }
#endif  // NDEBUG
  return true;
}